

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pawns.cpp
# Opt level: O2

bool backward_pawn<(Color)1>(int *row,int *col,U64 *pawns)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar1 = *col;
  iVar6 = -1;
  if (iVar1 < 7) {
    iVar6 = iVar1 + 1;
  }
  if (iVar1 < 1) {
    bVar3 = false;
  }
  else {
    uVar9 = 100;
    uVar8 = *pawns & (&bitboards::col)[iVar1 - 1];
    while (uVar7 = (uint)uVar9, uVar8 != 0) {
      uVar2 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      uVar8 = uVar8 & uVar8 - 1;
      if ((int)uVar7 < (int)uVar2) {
        uVar2 = uVar9;
      }
      uVar9 = uVar2 & 0xffffffff;
    }
    if ((99 < (int)uVar7) || (bVar3 = true, *row <= (int)(uVar7 >> 3))) {
      bVar3 = (*pawns & (&bitboards::col)[iVar1 - 1]) == 0;
    }
  }
  if (iVar6 == -1) {
    bVar4 = false;
    bVar5 = bVar3;
  }
  else {
    uVar9 = 100;
    uVar8 = *pawns & (&bitboards::col)[iVar6];
    while (uVar7 = (uint)uVar9, uVar8 != 0) {
      uVar2 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      uVar8 = uVar8 & uVar8 - 1;
      if ((int)uVar7 < (int)uVar2) {
        uVar2 = uVar9;
      }
      uVar9 = uVar2 & 0xffffffff;
    }
    if ((99 < (int)uVar7) || (bVar4 = true, *row <= (int)(uVar7 >> 3))) {
      bVar4 = (*pawns & (&bitboards::col)[iVar6]) == 0;
    }
    bVar5 = false;
    if ((iVar1 < 1) && (bVar4)) {
      return true;
    }
  }
  return (bool)(bVar3 & bVar4 | bVar5);
}

Assistant:

inline bool backward_pawn(const int& row, const int& col, const U64& pawns) {
	int left = col - 1 < Col::A ? -1 : col - 1;
	int right = col + 1 > Col::H ? -1 : col + 1;
	bool left_greater = false;
	bool right_greater = false;

	if (c == white) {
		if (left != -1) {
			int sq = -1;
			U64 left_pawns = bitboards::col[left] & pawns;
			while (left_pawns) {
				int tmp = bits::pop_lsb(left_pawns);
				if (tmp > sq) sq = tmp;
			}
			left_greater = sq > 0 && util::row(sq) > row;
		}

		if (right != -1) {
			int sq = -1;
			U64 right_pawns = bitboards::col[right] & pawns;
			bool no_right_pawns = (right_pawns == 0ULL);
			while (right_pawns) {
				int tmp = bits::pop_lsb(right_pawns);
				if (tmp > sq) sq = tmp;
			}
			right_greater = sq > 0 && util::row(sq) > row || no_right_pawns;
		}
	}
	else {
		if (left != -1) {
			int sq = 100;
			U64 left_pawns = bitboards::col[left] & pawns;
			bool no_left_pawns = (left_pawns == 0ULL);
			while (left_pawns) {
				int tmp = bits::pop_lsb(left_pawns);
				if (tmp < sq) sq = tmp;
			}
			left_greater = sq < 100 && util::row(sq) < row || no_left_pawns;
		}
		if (right != -1) {
			int sq = 100;
			U64 right_pawns = bitboards::col[right] & pawns;
			bool no_right_pawns = (right_pawns == 0ULL);
			while (right_pawns) {
				int tmp = bits::pop_lsb(right_pawns);
				if (tmp < sq) sq = tmp;
			}
			right_greater = sq < 100 && util::row(sq) < row || no_right_pawns;
		}
	}

	return (left == -1 && right_greater) ||
		(right == -1 && left_greater) ||
		(left_greater && right_greater);
}